

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O2

void __thiscall
leveldb::TableBuilder::WriteRawBlock
          (TableBuilder *this,Slice *block_contents,CompressionType type,BlockHandle *handle)

{
  long lVar1;
  Rep *pRVar2;
  char *pcVar3;
  uint32_t uVar4;
  long in_FS_OFFSET;
  Status local_48;
  undefined8 local_40;
  Status local_38;
  char trailer [5];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar2 = this->rep_;
  handle->offset_ = pRVar2->offset;
  handle->size_ = block_contents->size_;
  (*pRVar2->file->_vptr_WritableFile[2])(&local_48,pRVar2->file,block_contents);
  pcVar3 = (pRVar2->status).state_;
  (pRVar2->status).state_ = local_48.state_;
  local_48.state_ = pcVar3;
  Status::~Status(&local_48);
  if ((pRVar2->status).state_ == (char *)0x0) {
    trailer[0] = (char)type;
    uVar4 = crc32c::Value(block_contents->data_,block_contents->size_);
    uVar4 = crc32c::Extend(uVar4,trailer,1);
    EncodeFixed32(trailer + 1,(uVar4 << 0x11 | uVar4 >> 0xf) + 0xa282ead8);
    local_40 = 5;
    local_48.state_ = trailer;
    (*pRVar2->file->_vptr_WritableFile[2])(&local_38);
    pcVar3 = (pRVar2->status).state_;
    (pRVar2->status).state_ = local_38.state_;
    local_38.state_ = pcVar3;
    Status::~Status(&local_38);
    if ((pRVar2->status).state_ == (char *)0x0) {
      pRVar2->offset = block_contents->size_ + pRVar2->offset + 5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TableBuilder::WriteRawBlock(const Slice& block_contents,
                                 CompressionType type, BlockHandle* handle) {
  Rep* r = rep_;
  handle->set_offset(r->offset);
  handle->set_size(block_contents.size());
  r->status = r->file->Append(block_contents);
  if (r->status.ok()) {
    char trailer[kBlockTrailerSize];
    trailer[0] = type;
    uint32_t crc = crc32c::Value(block_contents.data(), block_contents.size());
    crc = crc32c::Extend(crc, trailer, 1);  // Extend crc to cover block type
    EncodeFixed32(trailer + 1, crc32c::Mask(crc));
    r->status = r->file->Append(Slice(trailer, kBlockTrailerSize));
    if (r->status.ok()) {
      r->offset += block_contents.size() + kBlockTrailerSize;
    }
  }
}